

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

void __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<int,_int>,_bool>,_absl::lts_20240722::hash_internal::Hash<std::pair<int,_int>_>,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_bool>_>_>
::dealloc(raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<int,_int>,_bool>,_absl::lts_20240722::hash_internal::Hash<std::pair<int,_int>_>,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_bool>_>_>
          *this)

{
  size_t sVar1;
  void *p;
  
  sVar1 = capacity(this);
  if (sVar1 != 0) {
    slot_array(this);
    capacity(this);
    infoz(this);
    p = CommonFields::backing_array_start((CommonFields *)this);
    sVar1 = CommonFields::alloc_size((CommonFields *)this,0xc,4);
    Deallocate<8ul,std::allocator<std::pair<std::pair<int,int>const,bool>>>
              ((allocator<std::pair<const_std::pair<int,_int>,_bool>_> *)this,p,sVar1);
    return;
  }
  __assert_fail("capacity() != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xdd5,
                "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::pair<int, int>, bool>, absl::hash_internal::Hash<std::pair<int, int>>, std::equal_to<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, bool>>>::dealloc() [Policy = absl::container_internal::FlatHashMapPolicy<std::pair<int, int>, bool>, Hash = absl::hash_internal::Hash<std::pair<int, int>>, Eq = std::equal_to<std::pair<int, int>>, Alloc = std::allocator<std::pair<const std::pair<int, int>, bool>>]"
               );
}

Assistant:

inline void dealloc() {
    assert(capacity() != 0);
    // Unpoison before returning the memory to the allocator.
    SanitizerUnpoisonMemoryRegion(slot_array(), sizeof(slot_type) * capacity());
    infoz().Unregister();
    Deallocate<BackingArrayAlignment(alignof(slot_type))>(
        &alloc_ref(), common().backing_array_start(),
        common().alloc_size(sizeof(slot_type), alignof(slot_type)));
  }